

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setPivot(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,int p_stage,int p_col,int p_row,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *val)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  pointer pnVar7;
  long lVar8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar9;
  uint *puVar10;
  cpp_dec_float<200U,_int,_void> *pcVar11;
  pointer pnVar12;
  bool bVar13;
  byte bVar14;
  Real a;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  fpclass_type local_148;
  cpp_dec_float<200U,_int,_void> local_138;
  cpp_dec_float<200U,_int,_void> local_b8;
  
  bVar14 = 0;
  (this->row).orig[p_stage] = p_row;
  (this->col).orig[p_stage] = p_col;
  (this->row).perm[p_row] = p_stage;
  (this->col).perm[p_col] = p_stage;
  local_b8.fpclass = cpp_dec_float_finite;
  local_b8.prec_elem = 0x1c;
  local_b8.data._M_elems[0] = 0;
  local_b8.data._M_elems[1] = 0;
  local_b8.data._M_elems[2] = 0;
  local_b8.data._M_elems[3] = 0;
  local_b8.data._M_elems[4] = 0;
  local_b8.data._M_elems[5] = 0;
  local_b8.data._M_elems[6] = 0;
  local_b8.data._M_elems[7] = 0;
  local_b8.data._M_elems[8] = 0;
  local_b8.data._M_elems[9] = 0;
  local_b8.data._M_elems[10] = 0;
  local_b8.data._M_elems[0xb] = 0;
  local_b8.data._M_elems[0xc] = 0;
  local_b8.data._M_elems[0xd] = 0;
  local_b8.data._M_elems[0xe] = 0;
  local_b8.data._M_elems[0xf] = 0;
  local_b8.data._M_elems[0x10] = 0;
  local_b8.data._M_elems[0x11] = 0;
  local_b8.data._M_elems[0x12] = 0;
  local_b8.data._M_elems[0x13] = 0;
  local_b8.data._M_elems[0x14] = 0;
  local_b8.data._M_elems[0x15] = 0;
  local_b8.data._M_elems[0x16] = 0;
  local_b8.data._M_elems[0x17] = 0;
  local_b8.data._M_elems[0x18] = 0;
  local_b8.data._M_elems[0x19] = 0;
  local_b8.data._M_elems._104_5_ = 0;
  local_b8.data._M_elems[0x1b]._1_3_ = 0;
  local_b8.exp = 0;
  local_b8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&local_b8,1.0);
  local_138.fpclass = cpp_dec_float_finite;
  local_138.prec_elem = 0x1c;
  local_138.data._M_elems[0] = 0;
  local_138.data._M_elems[1] = 0;
  local_138.data._M_elems[2] = 0;
  local_138.data._M_elems[3] = 0;
  local_138.data._M_elems[4] = 0;
  local_138.data._M_elems[5] = 0;
  local_138.data._M_elems[6] = 0;
  local_138.data._M_elems[7] = 0;
  local_138.data._M_elems[8] = 0;
  local_138.data._M_elems[9] = 0;
  local_138.data._M_elems[10] = 0;
  local_138.data._M_elems[0xb] = 0;
  local_138.data._M_elems[0xc] = 0;
  local_138.data._M_elems[0xd] = 0;
  local_138.data._M_elems[0xe] = 0;
  local_138.data._M_elems[0xf] = 0;
  local_138.data._M_elems[0x10] = 0;
  local_138.data._M_elems[0x11] = 0;
  local_138.data._M_elems[0x12] = 0;
  local_138.data._M_elems[0x13] = 0;
  local_138.data._M_elems[0x14] = 0;
  local_138.data._M_elems[0x15] = 0;
  local_138.data._M_elems[0x16] = 0;
  local_138.data._M_elems[0x17] = 0;
  local_138.data._M_elems[0x18] = 0;
  local_138.data._M_elems[0x19] = 0;
  local_138.data._M_elems._104_5_ = 0;
  local_138.data._M_elems[0x1b]._1_3_ = 0;
  local_138.exp = 0;
  local_138.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&local_138,&local_b8,&val->m_backend);
  pnVar7 = (this->diag).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pcVar11 = &local_138;
  pnVar12 = pnVar7 + p_row;
  for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
    (pnVar12->m_backend).data._M_elems[0] = (pcVar11->data)._M_elems[0];
    pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar14 * -8 + 4);
    pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar14 * -2 + 1) * 4);
  }
  pnVar7[p_row].m_backend.exp = local_138.exp;
  pnVar7[p_row].m_backend.neg = local_138.neg;
  pnVar7[p_row].m_backend.fpclass = local_138.fpclass;
  pnVar7[p_row].m_backend.prec_elem = local_138.prec_elem;
  pnVar9 = val;
  pcVar11 = &local_b8;
  for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
    (pcVar11->data)._M_elems[0] = (pnVar9->m_backend).data._M_elems[0];
    pnVar9 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar9 + ((ulong)bVar14 * -2 + 1) * 4);
    pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + ((ulong)bVar14 * -2 + 1) * 4);
  }
  local_b8.exp = (val->m_backend).exp;
  local_b8.neg = (val->m_backend).neg;
  uVar4._0_4_ = (val->m_backend).fpclass;
  uVar4._4_4_ = (val->m_backend).prec_elem;
  if ((local_b8.neg == true) &&
     (local_b8.data._M_elems[0] != 0 || (fpclass_type)uVar4 != cpp_dec_float_finite)) {
    local_b8.neg = false;
  }
  local_b8._120_8_ = uVar4;
  a = Tolerances::epsilonPivot
                ((this->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if (!NAN(a) && (fpclass_type)uVar4 != cpp_dec_float_NaN) {
    local_138.fpclass = cpp_dec_float_finite;
    local_138.prec_elem = 0x1c;
    local_138.data._M_elems[0] = 0;
    local_138.data._M_elems[1] = 0;
    local_138.data._M_elems[2] = 0;
    local_138.data._M_elems[3] = 0;
    local_138.data._M_elems[4] = 0;
    local_138.data._M_elems[5] = 0;
    local_138.data._M_elems[6] = 0;
    local_138.data._M_elems[7] = 0;
    local_138.data._M_elems[8] = 0;
    local_138.data._M_elems[9] = 0;
    local_138.data._M_elems[10] = 0;
    local_138.data._M_elems[0xb] = 0;
    local_138.data._M_elems[0xc] = 0;
    local_138.data._M_elems[0xd] = 0;
    local_138.data._M_elems[0xe] = 0;
    local_138.data._M_elems[0xf] = 0;
    local_138.data._M_elems[0x10] = 0;
    local_138.data._M_elems[0x11] = 0;
    local_138.data._M_elems[0x12] = 0;
    local_138.data._M_elems[0x13] = 0;
    local_138.data._M_elems[0x14] = 0;
    local_138.data._M_elems[0x15] = 0;
    local_138.data._M_elems[0x16] = 0;
    local_138.data._M_elems[0x17] = 0;
    local_138.data._M_elems[0x18] = 0;
    local_138.data._M_elems[0x19] = 0;
    local_138.data._M_elems._104_5_ = 0;
    local_138.data._M_elems[0x1b]._1_3_ = 0;
    local_138.exp = 0;
    local_138.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_138,a);
    iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                      (&local_b8,&local_138);
    if (iVar6 < 0) {
      this->stat = SINGULAR;
    }
  }
  pnVar7 = (this->diag).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar6 = pnVar7[p_row].m_backend.exp;
  bVar13 = pnVar7[p_row].m_backend.neg;
  uVar5._0_4_ = pnVar7[p_row].m_backend.fpclass;
  uVar5._4_4_ = pnVar7[p_row].m_backend.prec_elem;
  memmove(&local_138,pnVar7 + p_row,0x70);
  local_138.neg = bVar13;
  if ((bVar13 == true) &&
     (local_138.data._M_elems[0] != 0 || (fpclass_type)uVar5 != cpp_dec_float_finite)) {
    local_138.neg = false;
  }
  if (((fpclass_type)uVar5 != cpp_dec_float_NaN) &&
     ((this->maxabs).m_backend.fpclass != cpp_dec_float_NaN)) {
    local_138.exp = iVar6;
    local_138._120_8_ = uVar5;
    iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                      (&local_138,&(this->maxabs).m_backend);
    if (0 < iVar6) {
      pnVar7 = (this->diag).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start + p_row;
      uVar3 = (pnVar7->m_backend).data._M_elems[0];
      puVar10 = (uint *)((long)(pnVar7->m_backend).data._M_elems + 4);
      pcVar11 = &local_138;
      for (lVar8 = 0x1b; lVar8 != 0; lVar8 = lVar8 + -1) {
        (pcVar11->data)._M_elems[0] = *puVar10;
        puVar10 = puVar10 + (ulong)bVar14 * -2 + 1;
        pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + ((ulong)bVar14 * -2 + 1) * 4);
      }
      iVar6 = (pnVar7->m_backend).exp;
      bVar13 = (pnVar7->m_backend).neg;
      uVar1 = (pnVar7->m_backend).fpclass;
      uVar2 = (pnVar7->m_backend).prec_elem;
      if (bVar13 == true) {
        bVar13 = uVar1 == 0 && uVar3 == 0;
      }
      (this->maxabs).m_backend.data._M_elems[0] = uVar3;
      pcVar11 = &local_138;
      puVar10 = (this->maxabs).m_backend.data._M_elems + 1;
      for (lVar8 = 0x1b; lVar8 != 0; lVar8 = lVar8 + -1) {
        *puVar10 = (pcVar11->data)._M_elems[0];
        pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + ((ulong)bVar14 * -2 + 1) * 4);
        puVar10 = puVar10 + (ulong)bVar14 * -2 + 1;
      }
      (this->maxabs).m_backend.exp = iVar6;
      (this->maxabs).m_backend.neg = bVar13;
      (this->maxabs).m_backend.fpclass = uVar1;
      (this->maxabs).m_backend.prec_elem = uVar2;
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::setPivot(const int p_stage,
                            const int p_col,
                            const int p_row,
                            const R val)
{
   assert(row.perm[p_row] < 0);
   assert(col.perm[p_col] < 0);

   row.orig[p_stage] = p_row;
   col.orig[p_stage] = p_col;
   row.perm[p_row]   = p_stage;
   col.perm[p_col]   = p_stage;
   diag[p_row]       = R(1.0) / val;

   if(spxAbs(val) < _tolerances->epsilonPivot())
   {
#ifndef NDEBUG
      SPX_MSG_ERROR(std::cerr
                    << "LU pivot element is almost zero (< "
                    << _tolerances->epsilonPivot()
                    << ") - Basis is numerically singular"
                    << std::endl;)
#endif
      this->stat = SLinSolver<R>::SINGULAR;
   }

   if(spxAbs(diag[p_row]) > maxabs)
      maxabs = spxAbs(diag[p_row]);
}